

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O0

void __thiscall TRM::TinyRender::attachBuffer(TinyRender *this,TGAImage *image)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  float fVar6;
  ulong local_28;
  size_t i;
  int height;
  int width;
  TGAImage *image_local;
  TinyRender *this_local;
  
  this->mImage = image;
  if (((this->mImage != (TGAImage *)0x0) && (iVar2 = TGAImage::get_width(this->mImage), 0 < iVar2))
     && (iVar2 = TGAImage::get_height(this->mImage), 0 < iVar2)) {
    if (this->mZBuffer != (float *)0x0) {
      if (this->mZBuffer != (float *)0x0) {
        operator_delete__(this->mZBuffer);
      }
      this->mZBuffer = (float *)0x0;
    }
    iVar2 = TGAImage::get_width(this->mImage);
    iVar3 = TGAImage::get_height(this->mImage);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(iVar2 * iVar3);
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pfVar5 = (float *)operator_new__(uVar4);
    this->mZBuffer = pfVar5;
    for (local_28 = 0; local_28 < (ulong)(long)(iVar2 * iVar3); local_28 = local_28 + 1) {
      fVar6 = std::numeric_limits<float>::max();
      this->mZBuffer[local_28] = fVar6;
    }
  }
  return;
}

Assistant:

void TinyRender::attachBuffer(TGAImage* image) {
  mImage = image;
  if (mImage != nullptr && mImage->get_width() > 0 &&
      mImage->get_height() > 0) {
    if (mZBuffer != nullptr) {
      delete[] mZBuffer;
      mZBuffer = nullptr;
    }

    int width = mImage->get_width();
    int height = mImage->get_height();
    mZBuffer = new float[width * height];
    for (size_t i = 0; i < width * height; i++) {
      mZBuffer[i] = std::numeric_limits<float>::max();
    }
  }
}